

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

CBlockIndex * __thiscall Chainstate::FindForkInGlobalIndex(Chainstate *this,CBlockLocator *locator)

{
  long lVar1;
  bool bVar2;
  CBlockIndex *pCVar3;
  uint256 *in_RDI;
  long in_FS_OFFSET;
  CBlockIndex *pindex;
  uint256 *hash;
  vector<uint256,_std::allocator<uint256>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  CChain *in_stack_ffffffffffffff98;
  BlockManager *in_stack_ffffffffffffffa0;
  CBlockIndex *in_stack_ffffffffffffffa8;
  BlockManager *in_stack_ffffffffffffffb8;
  BlockManager *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
             (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
             (AnnotatedMixin<std::recursive_mutex> *)0x1486619);
  std::vector<uint256,_std::allocator<uint256>_>::begin
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffffa0);
  std::vector<uint256,_std::allocator<uint256>_>::end
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffffa0);
  do {
    bVar2 = __gnu_cxx::operator==<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                      ((__normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                        *)in_stack_ffffffffffffffa8,
                       (__normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                        *)in_stack_ffffffffffffffa0);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_20 = (BlockManager *)CChain::Genesis((CChain *)in_stack_ffffffffffffffa8);
LAB_01486735:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return (CBlockIndex *)local_20;
    }
    pCVar3 = (CBlockIndex *)
             __gnu_cxx::
             __normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>::
             operator*((__normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                        *)in_stack_ffffffffffffff98);
    in_stack_ffffffffffffffb8 =
         (BlockManager *)::node::BlockManager::LookupBlockIndex(in_stack_ffffffffffffffb8,in_RDI);
    if (in_stack_ffffffffffffffb8 != (BlockManager *)0x0) {
      bVar2 = CChain::Contains((CChain *)in_stack_ffffffffffffffa8,
                               (CBlockIndex *)in_stack_ffffffffffffffa0);
      in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffb8;
      local_20 = in_stack_ffffffffffffffa0;
      if (bVar2) goto LAB_01486735;
      in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffa0;
      CChain::Height(in_stack_ffffffffffffff98);
      in_stack_ffffffffffffffa8 =
           CBlockIndex::GetAncestor(pCVar3,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      pCVar3 = CChain::Tip((CChain *)in_stack_ffffffffffffffa8);
      if (in_stack_ffffffffffffffa8 == pCVar3) {
        local_20 = (BlockManager *)CChain::Tip((CChain *)in_stack_ffffffffffffffa8);
        goto LAB_01486735;
      }
    }
    __gnu_cxx::__normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>::
    operator++((__normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                *)in_stack_ffffffffffffff98);
  } while( true );
}

Assistant:

const CBlockIndex* Chainstate::FindForkInGlobalIndex(const CBlockLocator& locator) const
{
    AssertLockHeld(cs_main);

    // Find the latest block common to locator and chain - we expect that
    // locator.vHave is sorted descending by height.
    for (const uint256& hash : locator.vHave) {
        const CBlockIndex* pindex{m_blockman.LookupBlockIndex(hash)};
        if (pindex) {
            if (m_chain.Contains(pindex)) {
                return pindex;
            }
            if (pindex->GetAncestor(m_chain.Height()) == m_chain.Tip()) {
                return m_chain.Tip();
            }
        }
    }
    return m_chain.Genesis();
}